

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

LinearConHandler __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnLinearConExpr
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int con_index,
          int num_linear_terms)

{
  LinearConBuilder LVar1;
  MutAlgebraicCon MVar2;
  MutAlgebraicCon local_18;
  
  MVar2 = BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con(this->builder_,con_index);
  local_18.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       MVar2.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_18.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       MVar2.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  LVar1 = BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_linear_expr
                    (&local_18,num_linear_terms);
  return (LinearConHandler)LVar1.expr_;
}

Assistant:

LinearConHandler OnLinearConExpr(int con_index, int num_linear_terms) {
    return builder_.algebraic_con(con_index).set_linear_expr(num_linear_terms);
  }